

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall
Constructor::markSubtableOperands(Constructor *this,vector<int,_std::allocator<int>_> *check)

{
  int iVar1;
  size_type sVar2;
  const_reference ppOVar3;
  TripleSymbol *pTVar4;
  reference pvVar5;
  TripleSymbol *sym;
  int4 i;
  vector<int,_std::allocator<int>_> *check_local;
  Constructor *this_local;
  
  sVar2 = std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::size(&this->operands);
  std::vector<int,_std::allocator<int>_>::resize(check,sVar2);
  sym._4_4_ = 0;
  do {
    sVar2 = std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::size(&this->operands);
    if (sVar2 <= (ulong)(long)sym._4_4_) {
      return;
    }
    ppOVar3 = std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::operator[]
                        (&this->operands,(long)sym._4_4_);
    pTVar4 = OperandSymbol::getDefiningSymbol(*ppOVar3);
    if (pTVar4 == (TripleSymbol *)0x0) {
LAB_006e2865:
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](check,(long)sym._4_4_);
      *pvVar5 = 2;
    }
    else {
      iVar1 = (*(pTVar4->super_SleighSymbol)._vptr_SleighSymbol[2])();
      if (iVar1 != 0xb) goto LAB_006e2865;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](check,(long)sym._4_4_);
      *pvVar5 = 0;
    }
    sym._4_4_ = sym._4_4_ + 1;
  } while( true );
}

Assistant:

void Constructor::markSubtableOperands(vector<int4> &check) const

{ // Adjust -check- so it has one entry for every operand, a 0 if it is a subtable, a 2 if it is not
  check.resize(operands.size());
  for(int4 i=0;i<operands.size();++i) {
    TripleSymbol *sym = operands[i]->getDefiningSymbol();
    if ((sym != (TripleSymbol *)0)&&(sym->getType() == SleighSymbol::subtable_symbol))
      check[i] = 0;
    else
      check[i] = 2;
  }
}